

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O2

int32_t __thiscall
helics::MessageTimer::addTimer(MessageTimer *this,time_type expirationTime,ActionMessage *mess)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  service_type *psVar4;
  epoll_reactor *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long lVar6;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
  *this_01;
  int32_t iVar7;
  undefined8 uVar8;
  long *in_FS_OFFSET;
  time_type expirationTime_local;
  type local_98;
  ptr local_80;
  type timerCallback;
  unique_lock<std::mutex> lock;
  shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
  timer;
  
  expirationTime_local = expirationTime;
  std::
  make_shared<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
            ((io_context *)&timer);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::expires_at(timer.
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&expirationTime_local);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->timerLock);
  psVar1 = (this->timers).
           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->timers).
           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<helics::MessageTimer,void>
            ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&timerCallback,
             (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
  iVar7 = (int32_t)((ulong)((long)psVar1 - (long)psVar2) >> 4);
  timerCallback.index = iVar7;
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
  emplace_back<helics::ActionMessage>(&this->buffers,mess);
  std::
  vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::push_back(&this->expirationTimes,&expirationTime_local);
  std::
  vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>>
  ::
  emplace_back<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>
            ((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>>
              *)&this->timers,&timer);
  lVar6 = std::chrono::_V2::steady_clock::now();
  if (lVar6 < (long)expirationTime_local.__d.__r) {
    peVar3 = (this->timers).
             super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)&local_98,
               (__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)&timerCallback);
    local_98.index = timerCallback.index;
    psVar4 = (peVar3->impl_).service_;
    if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
    }
    local_80.h = &local_98;
    this_01 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
               *)asio::detail::thread_info_base::
                 allocate<asio::detail::thread_info_base::default_tag>(uVar8,0x80,8);
    local_80.v = this_01;
    asio::detail::wait_op::wait_op
              ((wait_op *)this_01,
               asio::detail::
               wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>
               ::do_complete);
    _Var5._M_pi = local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_01->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (this_01->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_01->handler_).index = local_98.index;
    asio::detail::
    handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
    handler_work_base(&(this_01->work_).
                       super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                      ,0,0,&(peVar3->impl_).executor_);
    this_00 = psVar4->scheduler_;
    (peVar3->impl_).implementation_.might_have_pending_waits = true;
    local_80.p = this_01;
    asio::detail::epoll_reactor::
    schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              (this_00,&psVar4->timer_queue_,&(peVar3->impl_).implementation_.expiry,
               &(peVar3->impl_).implementation_.timer_data,(wait_op *)this_01);
    local_80.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)0x0;
    local_80.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)0x0;
    asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_asio::any_io_executor>
    ::ptr::reset(&local_80);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::unique_lock<std::mutex>::unlock(&lock);
    local_80.h = (type *)((ulong)local_80.h._4_4_ << 0x20);
    local_80.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_asio::any_io_executor>
                  *)std::_V2::system_category();
    std::
    conditional<false,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26)_&,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26)>
    ::type::operator()(&timerCallback,(error_code *)&local_80);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timerCallback.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timer.
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return iVar7;
}

Assistant:

int32_t MessageTimer::addTimer(time_type expirationTime, ActionMessage mess)
{
    // these two calls need to be before the lock
    auto timer = std::make_shared<asio::steady_timer>(contextPtr->getBaseContext());
    timer->expires_at(expirationTime);

    std::unique_lock<std::mutex> lock(timerLock);

    auto index = static_cast<int32_t>(timers.size());
    auto timerCallback = [ptr = shared_from_this(), index](const std::error_code& ec) {
        processTimerCallback(ptr, index, ec);
    };
    buffers.push_back(std::move(mess));
    expirationTimes.push_back(expirationTime);
    timers.push_back(std::move(timer));
    if (expirationTime > std::chrono::steady_clock::now()) {
        timers.back()->async_wait(timerCallback);
    } else {
        lock.unlock();
        timerCallback(std::error_code{});
    }

    return index;
}